

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

int os_get_abs_filename(char *buf,size_t buflen,char *filename)

{
  int iVar1;
  char *pcVar2;
  unique_ptr<char,_void_(*)(void_*)> newpath;
  
  iVar1 = os_is_file_absolute(filename);
  if (iVar1 == 0) {
    pcVar2 = getcwd((char *)&newpath,0x1000);
    if (pcVar2 != (char *)0x0) {
      os_build_full_path(buf,buflen,(char *)&newpath,filename);
      goto LAB_0010ef62;
    }
  }
  safe_strcpy(buf,buflen,filename);
LAB_0010ef62:
  canonicalize_path(buf);
  newpath._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
       = realpath(filename,(char *)0x0);
  newpath._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)free;
  if (newpath._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
      _M_head_impl != (char *)0x0) {
    safe_strcpy(buf,buflen,
                newpath._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl);
  }
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&newpath);
  return 1;
}

Assistant:

int
os_get_abs_filename( char* buf, size_t buflen, const char* filename )
{
    // If the filename is already absolute, copy it; otherwise combine
    // it with the working directory.
    if (os_is_file_absolute(filename))
    {
        // absolute - copy it as-is
        safe_strcpy(buf, buflen, filename);
    }
    else
    {
        // combine it with the working directory to get the path
        char pwd[OSFNMAX];
        if (getcwd(pwd, sizeof(pwd)) != 0)
            os_build_full_path(buf, buflen, pwd, filename);
        else
            safe_strcpy(buf, buflen, filename);
    }

    // canonicalize the result
    canonicalize_path(buf);

    // Try getting the canonical path from the OS (allocating the
    // result buffer).
    const std::unique_ptr<char, decltype(&free)>
            newpath(realpath(filename, nullptr), &free);
    if (newpath) {
        // Copy the output (truncating if it's too long).
        safe_strcpy(buf, buflen, newpath.get());
    }

    // realpath() might have failed, but that's okay - realpath() only works
    // if the path refers to an existing file, but it's valid for callers to
    // pass non-existent filenames, such as names of files they're about to
    // create, or hypothetical paths being used for comparison purposes or
    // for future use.  Simply return the canonical path name we generated
    // above.
    return true;
}